

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t canZstd(void)

{
  wchar_t wVar1;
  
  if (canZstd_tested == '\0') {
    canZstd_tested = '\x01';
    wVar1 = systemf("zstd --help %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canZstd_value = 1;
    }
  }
  return (uint)canZstd_value;
}

Assistant:

int
canZstd(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("zstd --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}